

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O2

int anycb(int f)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  buffer **bp;
  char local_448 [8];
  char pbuf [1035];
  
  bVar4 = true;
  bp = &bheadp;
  iVar5 = 0;
  iVar6 = 0;
  iVar3 = 0;
  do {
    do {
      bp = (buffer **)(((buffer *)bp)->b_list).l_p.x_bp;
      if ((buffer *)bp == (buffer *)0x0) {
        if (bVar4) {
          ewprintf("(No files need saving)");
          return iVar5;
        }
        return iVar5;
      }
    } while ((((buffer *)bp)->b_fname[0] == '\0') || ((((buffer *)bp)->b_flag & 1U) == 0));
    uVar1 = snprintf(local_448,0x40b,"Save file %s");
    if (0x40a < uVar1) {
      dobeep_msg("Error: filename too long!");
      return 3;
    }
    if (f == 1) {
LAB_00108f08:
      iVar2 = iVar6;
      iVar3 = buffsave((buffer *)bp);
      if (iVar3 != 1) goto LAB_00108f35;
      ((buffer *)bp)->b_flag = ((buffer *)bp)->b_flag & 0xfe;
      upmodes((buffer *)bp);
      iVar3 = 1;
    }
    else {
      iVar2 = eyorn(local_448);
      iVar6 = 1;
      if (iVar2 == 1) goto LAB_00108f08;
LAB_00108f35:
      iVar5 = 1;
      if (iVar3 == 3) {
        return 3;
      }
    }
    bVar4 = false;
    iVar6 = 1;
    if (iVar2 == 2) {
      return 2;
    }
  } while( true );
}

Assistant:

int
anycb(int f)
{
	struct buffer	*bp;
	int		 s = FALSE, save = FALSE, save2 = FALSE, ret;
	char		 pbuf[NFILEN + 11];

	for (bp = bheadp; bp != NULL; bp = bp->b_bufp) {
		if (*(bp->b_fname) != '\0' && (bp->b_flag & BFCHG) != 0) {
			ret = snprintf(pbuf, sizeof(pbuf), "Save file %s",
			    bp->b_fname);
			if (ret < 0 || ret >= sizeof(pbuf)) {
				(void)dobeep_msg("Error: filename too long!");
				return (UERROR);
			}
			if ((f == TRUE || (save = eyorn(pbuf)) == TRUE) &&
			    (save2 = buffsave(bp)) == TRUE) {
				bp->b_flag &= ~BFCHG;
				upmodes(bp);
			} else {
				if (save2 == FIOERR)
					return (save2);
				s = TRUE;
			}
			if (save == ABORT)
				return (save);
			save = TRUE;
		}
	}
	if (save == FALSE /* && kbdmop == NULL */ )	/* experimental */
		ewprintf("(No files need saving)");
	return (s);
}